

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O3

void __thiscall
nigel::IMC_Generator::parseCondition
          (IMC_Generator *this,shared_ptr<nigel::AstExpr> *ast,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
          *varList)

{
  char cVar1;
  Type TVar2;
  Type TVar3;
  element_type *peVar4;
  element_type *peVar5;
  int iVar6;
  undefined8 uVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  mapped_type *pmVar9;
  OperationType unaff_EBP;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  uchar local_749;
  undefined1 local_748 [16];
  shared_ptr<nigel::IM_Command> conditionPos;
  SFR local_71c;
  shared_ptr<nigel::AstComparisonCondition> a;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_708;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_700;
  shared_ptr<nigel::Token> local_6f8;
  shared_ptr<nigel::AstExpr> local_6e8;
  shared_ptr<nigel::AstExpr> local_6d8;
  shared_ptr<nigel::AstExpr> local_6c8;
  shared_ptr<nigel::AstExpr> local_6b8;
  shared_ptr<nigel::AstExpr> local_6a8;
  shared_ptr<nigel::Token> local_698;
  shared_ptr<nigel::IM_Operator> local_688;
  shared_ptr<nigel::IM_Operator> local_678;
  shared_ptr<nigel::Token> local_668;
  shared_ptr<nigel::IM_Operator> local_658;
  shared_ptr<nigel::IM_Operator> local_648;
  shared_ptr<nigel::Token> local_638;
  shared_ptr<nigel::IM_Operator> local_628;
  shared_ptr<nigel::IM_Operator> local_618;
  shared_ptr<nigel::Token> local_608;
  shared_ptr<nigel::IM_Operator> local_5f8;
  shared_ptr<nigel::IM_Operator> local_5e8;
  shared_ptr<nigel::Token> local_5d8;
  shared_ptr<nigel::IM_Operator> local_5c8;
  shared_ptr<nigel::IM_Operator> local_5b8;
  shared_ptr<nigel::Token> local_5a8;
  shared_ptr<nigel::IM_Operator> local_598;
  shared_ptr<nigel::IM_Operator> local_588;
  shared_ptr<nigel::AstExpr> local_578;
  shared_ptr<nigel::AstExpr> local_568;
  shared_ptr<nigel::IM_Operator> local_558;
  shared_ptr<nigel::AstExpr> local_548;
  shared_ptr<nigel::AstExpr> local_538;
  undefined1 local_528 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_510;
  undefined1 local_508 [64];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_4c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_498;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_468;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_438;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_408;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_3d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_3a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_378;
  shared_ptr<nigel::IM_Operator> local_348;
  shared_ptr<nigel::IM_Operator> local_338;
  shared_ptr<nigel::IM_Operator> local_328;
  shared_ptr<nigel::IM_Operator> local_318;
  shared_ptr<nigel::IM_Operator> local_308;
  shared_ptr<nigel::IM_Operator> local_2f8;
  shared_ptr<nigel::IM_Operator> local_2e8;
  shared_ptr<nigel::IM_Operator> local_2d8;
  shared_ptr<nigel::IM_Operator> local_2c8;
  shared_ptr<nigel::IM_Operator> local_2b8;
  shared_ptr<nigel::IM_Operator> local_2a8;
  shared_ptr<nigel::IM_Operator> local_298;
  shared_ptr<nigel::IM_Operator> local_288;
  shared_ptr<nigel::IM_Operator> local_278;
  shared_ptr<nigel::IM_Operator> local_268;
  shared_ptr<nigel::IM_Operator> local_258;
  shared_ptr<nigel::IM_Operator> local_248;
  shared_ptr<nigel::IM_Operator> local_238;
  shared_ptr<nigel::IM_Operator> local_228;
  shared_ptr<nigel::IM_Operator> local_218;
  shared_ptr<nigel::IM_Operator> local_208;
  shared_ptr<nigel::IM_Operator> local_1f8;
  shared_ptr<nigel::IM_Operator> local_1e8;
  shared_ptr<nigel::IM_Operator> local_1d8;
  shared_ptr<nigel::IM_Operator> local_1c8;
  shared_ptr<nigel::IM_Operator> local_1b8;
  shared_ptr<nigel::IM_Operator> local_1a8;
  shared_ptr<nigel::IM_Operator> local_198;
  shared_ptr<nigel::IM_Operator> local_188;
  shared_ptr<nigel::IM_Operator> local_178;
  shared_ptr<nigel::IM_Operator> local_168;
  shared_ptr<nigel::IM_Operator> local_158;
  shared_ptr<nigel::IM_Operator> local_148;
  shared_ptr<nigel::IM_Operator> local_138;
  shared_ptr<nigel::IM_Operator> local_128;
  shared_ptr<nigel::IM_Operator> local_118;
  shared_ptr<nigel::IM_Operator> local_108;
  shared_ptr<nigel::IM_Operator> local_f8;
  shared_ptr<nigel::IM_Operator> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  shared_ptr<nigel::IM_Operator> local_c8;
  shared_ptr<nigel::IM_Operator> local_b8;
  shared_ptr<nigel::IM_Operator> local_a8;
  shared_ptr<nigel::IM_Operator> local_98;
  shared_ptr<nigel::IM_Operator> local_88;
  shared_ptr<nigel::IM_Operator> local_78;
  shared_ptr<nigel::IM_Operator> local_68;
  shared_ptr<nigel::IM_Operator> local_58;
  shared_ptr<nigel::IM_Operator> local_48;
  shared_ptr<nigel::IM_Operator> local_38;
  
  peVar4 = (ast->super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  switch(peVar4->type) {
  case booleanParenthesis:
    AstExpr::as<nigel::AstBooleanParenthesis>((AstExpr *)&a);
    local_538.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &(((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->lVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_AstExpr;
    local_538.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         lVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (local_538.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_538.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_538.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_538.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_538.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
    ::_Rb_tree(&local_378,&varList->_M_t);
    parseCondition(this,&local_538,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                    *)&local_378);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
    ::~_Rb_tree(&local_378);
    _Var10 = a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
    if (local_538.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_538.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var10 = a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    }
    goto joined_r0x0015a0cd;
  default:
    local_6f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar4->token).super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_6f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (peVar4->token).super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_6f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_6f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_6f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_6f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_6f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,err_expectConditionInParanthesis,&local_6f8);
    _Var10._M_pi = local_6f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
joined_r0x0015a0cd:
    if (_Var10._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    goto LAB_0015b870;
  case keywordCondition:
    AstExpr::as<nigel::AstKeywordCondition>((AstExpr *)&a);
    cVar1 = *(char *)&((a.
                        super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->lVal).
                      super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (cVar1 != '\0') {
      return;
    }
    local_708._M_pi._0_1_ = 2;
    std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
              ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)&a,
               (allocator<nigel::IM_Constant> *)&conditionPos,(uchar *)&local_708);
    _Var8 = a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    local_38.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,jmp_rel,&local_38,&local_168);
    _Var10 = a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
    if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
      _Var10 = a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    }
    break;
  case arithmenticCondition:
    AstExpr::as<nigel::AstArithmeticCondition>((AstExpr *)&a);
    peVar5 = ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->lVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    _Var10._M_pi = ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->lVal).
                   super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
    if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var10._M_pi)->_M_use_count = (_Var10._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var10._M_pi)->_M_use_count = (_Var10._M_pi)->_M_use_count + 1;
      }
    }
    if (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    TVar2 = (peVar5->super_AstExpr).type;
    if (TVar2 < count) {
      if ((0x1a004cU >> (TVar2 & (functionDefinition|breakStat)) & 1) == 0) {
        if (TVar2 == variable) {
          AstExpr::as<nigel::AstVariable>((AstExpr *)&conditionPos);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                   ::operator[](varList,(key_type *)
                                        &((conditionPos.
                                           super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->symbol)._M_string_length);
          a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (pmVar9->super___shared_ptr<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&a.
                      super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(pmVar9->super___shared_ptr<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
          if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (conditionPos.
                       super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
          }
          unaff_EBP = v;
        }
        else if (TVar2 == literal) {
          AstExpr::as<nigel::AstLiteral>((AstExpr *)local_508);
          IM_Constant::fromAstLiteral((shared_ptr<nigel::AstLiteral> *)&conditionPos);
          _Var8 = a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
          a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount = conditionPos.
                        super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
          a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi),
             conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (conditionPos.
                       super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
          }
          if ((element_type *)local_508._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_);
          }
          unaff_EBP = c;
        }
      }
      else {
        if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (_Var10._M_pi)->_M_use_count = (_Var10._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (_Var10._M_pi)->_M_use_count = (_Var10._M_pi)->_M_use_count + 1;
          }
        }
        local_548.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &peVar5->super_AstExpr;
        local_548.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var10._M_pi;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::_Rb_tree(&local_3a8,&varList->_M_t);
        parseAst(this,&local_548,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                  *)&local_3a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::~_Rb_tree(&local_3a8);
        unaff_EBP = t;
        if (local_548.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_548.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
    }
    local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    if (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    generateMoveA(this,unaff_EBP,&local_558);
    if (local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_748[0] = 2;
    std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
              ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)&conditionPos,
               (allocator<nigel::IM_Constant> *)&local_708,local_748);
    _Var8 = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,jmp_z_rel,&local_48,&local_178);
    if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    break;
  case comparisonCondition:
    AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)&a);
    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_708._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_700._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peVar5 = ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->rVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    TVar2 = (peVar5->super_AstExpr).type;
    if (TVar2 < count) {
      if ((0x1a004cU >> (TVar2 & (functionDefinition|breakStat)) & 1) == 0) {
        if (TVar2 == variable) {
          AstExpr::as<nigel::AstVariable>((AstExpr *)local_748);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                   ::operator[](varList,(key_type *)
                                        &((String *)(local_748._0_8_ + 0x30))->_M_string_length);
          local_708._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (pmVar9->super___shared_ptr<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&_Stack_700,
                     &(pmVar9->super___shared_ptr<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
          local_510 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
        }
        else {
          if (TVar2 != literal) goto LAB_0015a353;
          AstExpr::as<nigel::AstLiteral>((AstExpr *)(local_528 + 0x10));
          IM_Constant::fromAstLiteral((shared_ptr<nigel::AstLiteral> *)local_748);
          _Var10._M_pi = _Stack_700._M_pi;
          _Stack_700._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
          local_708._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._0_8_;
          local_748._0_8_ = (element_type *)0x0;
          local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
          }
        }
      }
      else {
        local_568.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->rVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_568.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_568.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_568.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_568.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_568.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_568.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &peVar5->super_AstExpr;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::_Rb_tree(&local_3d8,&varList->_M_t);
        parseAst(this,&local_568,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                  *)&local_3d8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::~_Rb_tree(&local_3d8);
        if (local_568.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_568.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        TVar2 = ((((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->lVal).
                  super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_AstExpr).type;
        if ((TVar2 < count) && ((0x1a004cU >> (TVar2 & (functionDefinition|breakStat)) & 1) != 0)) {
          local_71c = A;
          std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                    ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_748,
                     (allocator<nigel::IM_SFR> *)&local_749,&local_71c);
          uVar7 = local_748._8_8_;
          local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_748._0_8_;
          local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
          local_748._0_8_ = (element_type *)0x0;
          local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,push_adr,&local_58,&local_188);
          local_510 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
            local_510 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
          }
        }
        else {
          local_71c = B;
          std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                    ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_748,
                     (allocator<nigel::IM_SFR> *)&local_749,&local_71c);
          uVar7 = local_748._8_8_;
          local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_748._0_8_;
          local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
          local_748._0_8_ = (element_type *)0x0;
          local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,mov_adr_a,&local_68,&local_198);
          local_510 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
            local_510 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
          }
        }
      }
      if (local_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_510);
      }
    }
LAB_0015a353:
    peVar5 = ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->lVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    TVar2 = (peVar5->super_AstExpr).type;
    if (TVar2 < count) {
      if ((0x1a004cU >> (TVar2 & (functionDefinition|breakStat)) & 1) == 0) {
        if (TVar2 == variable) {
          AstExpr::as<nigel::AstVariable>((AstExpr *)local_748);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                   ::operator[](varList,(key_type *)
                                        &((String *)(local_748._0_8_ + 0x30))->_M_string_length);
          conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (pmVar9->super___shared_ptr<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
                     &(pmVar9->super___shared_ptr<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
          }
          switch(((((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->rVal).
                   super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super_AstExpr).type) {
          case variable:
            unaff_EBP = v;
            break;
          default:
            unaff_EBP = t;
            break;
          case literal:
            unaff_EBP = c;
          }
        }
        else if (TVar2 == literal) {
          AstExpr::as<nigel::AstLiteral>((AstExpr *)local_528);
          IM_Constant::fromAstLiteral((shared_ptr<nigel::AstLiteral> *)local_748);
          _Var10 = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
          conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
          conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_748._0_8_;
          local_748._0_8_ = (element_type *)0x0;
          local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
          }
          if ((element_type *)local_528._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._8_8_);
          }
          switch(((((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->rVal).
                   super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super_AstExpr).type) {
          case variable:
            unaff_EBP = count;
            break;
          default:
            unaff_EBP = 5;
            break;
          case literal:
            unaff_EBP = 4;
          }
        }
      }
      else {
        local_578.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->lVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_578.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_578.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_578.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_578.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_578.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_578.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &peVar5->super_AstExpr;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::_Rb_tree(&local_408,&varList->_M_t);
        parseAst(this,&local_578,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                  *)&local_408);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::~_Rb_tree(&local_408);
        if (local_578.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_578.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        TVar2 = ((((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->rVal).
                  super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_AstExpr).type;
        unaff_EBP = 6;
        if (TVar2 < count) {
          if ((0x1a004cU >> (TVar2 & (functionDefinition|breakStat)) & 1) == 0) {
            if (TVar2 == literal) {
              unaff_EBP = 7;
            }
          }
          else {
            local_71c = B;
            std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                      ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_748,
                       (allocator<nigel::IM_SFR> *)&local_749,&local_71c);
            uVar7 = local_748._8_8_;
            local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_748._0_8_;
            local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
            local_748._0_8_ = (element_type *)0x0;
            local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            addCmd(this,pop_adr,&local_78,&local_1a8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
            }
            unaff_EBP = 8;
          }
        }
      }
    }
    switch((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->op) {
    case op_eql:
      local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,clr_c,&local_1b8,&local_1c8);
      local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_708._M_pi;
      local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Stack_700._M_pi;
      if (_Stack_700._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_700._M_pi)->_M_use_count = (_Stack_700._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_700._M_pi)->_M_use_count = (_Stack_700._M_pi)->_M_use_count + 1;
        }
      }
      local_5a8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_AstCondition).super_AstExpr.token.
           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_5a8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_AstCondition).super_AstExpr.token.
           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_5a8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_5a8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_5a8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_5a8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_5a8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      generateOperation(this,unaff_EBP,sub_a_adr,sub_a_const,sub_a_atr0,&local_588,&local_598,
                        &local_5a8);
      if (local_5a8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_5a8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_749 = '\x02';
      std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
                ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)local_748,
                 (allocator<nigel::IM_Constant> *)&local_71c,&local_749);
      uVar7 = local_748._8_8_;
      local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_748._0_8_;
      local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
      local_748._0_8_ = (element_type *)0x0;
      local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_nz_rel,&local_88,&local_1d8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
      break;
    case op_not_eql:
      local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,clr_c,&local_1e8,&local_1f8);
      local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_708._M_pi;
      local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Stack_700._M_pi;
      if (_Stack_700._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_700._M_pi)->_M_use_count = (_Stack_700._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_700._M_pi)->_M_use_count = (_Stack_700._M_pi)->_M_use_count + 1;
        }
      }
      local_5d8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_AstCondition).super_AstExpr.token.
           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_5d8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_AstCondition).super_AstExpr.token.
           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_5d8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_5d8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_5d8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_5d8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_5d8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      generateOperation(this,unaff_EBP,sub_a_adr,sub_a_const,sub_a_atr0,&local_5b8,&local_5c8,
                        &local_5d8);
      if (local_5d8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_5d8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_749 = '\x02';
      std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
                ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)local_748,
                 (allocator<nigel::IM_Constant> *)&local_71c,&local_749);
      uVar7 = local_748._8_8_;
      local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_748._0_8_;
      local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
      local_748._0_8_ = (element_type *)0x0;
      local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_z_rel,&local_98,&local_208);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
      break;
    case op_less:
      local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,clr_c,&local_218,&local_228);
      local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_708._M_pi;
      local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Stack_700._M_pi;
      if (_Stack_700._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_700._M_pi)->_M_use_count = (_Stack_700._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_700._M_pi)->_M_use_count = (_Stack_700._M_pi)->_M_use_count + 1;
        }
      }
      local_608.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_AstCondition).super_AstExpr.token.
           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_608.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_AstCondition).super_AstExpr.token.
           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_608.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_608.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_608.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_608.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_608.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      generateOperation(this,unaff_EBP,sub_a_adr,sub_a_const,sub_a_atr0,&local_5e8,&local_5f8,
                        &local_608);
      if (local_608.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_608.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_749 = '\x02';
      std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
                ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)local_748,
                 (allocator<nigel::IM_Constant> *)&local_71c,&local_749);
      uVar7 = local_748._8_8_;
      local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_748._0_8_;
      local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
      local_748._0_8_ = (element_type *)0x0;
      local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_nc_rel,&local_a8,&local_238);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
      break;
    case op_more:
      local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,clr_c,&local_248,&local_258);
      local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_708._M_pi;
      local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Stack_700._M_pi;
      if (_Stack_700._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_700._M_pi)->_M_use_count = (_Stack_700._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_700._M_pi)->_M_use_count = (_Stack_700._M_pi)->_M_use_count + 1;
        }
      }
      local_638.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_AstCondition).super_AstExpr.token.
           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_638.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_AstCondition).super_AstExpr.token.
           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_638.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_638.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_638.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_638.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_638.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      generateOperation(this,unaff_EBP,sub_a_adr,sub_a_const,sub_a_atr0,&local_618,&local_628,
                        &local_638);
      if (local_638.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_638.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_749 = '\x04';
      std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
                ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)local_748,
                 (allocator<nigel::IM_Constant> *)&local_71c,&local_749);
      uVar7 = local_748._8_8_;
      local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_748._0_8_;
      local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
      local_748._0_8_ = (element_type *)0x0;
      local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_c_rel,&local_b8,&local_268);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
      }
      local_749 = '\x02';
      std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
                ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)local_748,
                 (allocator<nigel::IM_Constant> *)&local_71c,&local_749);
      uVar7 = local_748._8_8_;
      local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_748._0_8_;
      local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
      local_748._0_8_ = (element_type *)0x0;
      local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_z_rel,&local_c8,&local_278);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
      break;
    case op_less_eql:
      local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,clr_c,&local_288,&local_298);
      local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_708._M_pi;
      local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Stack_700._M_pi;
      if (_Stack_700._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_700._M_pi)->_M_use_count = (_Stack_700._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_700._M_pi)->_M_use_count = (_Stack_700._M_pi)->_M_use_count + 1;
        }
      }
      local_668.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_AstCondition).super_AstExpr.token.
           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_668.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_AstCondition).super_AstExpr.token.
           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_668.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_668.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_668.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_668.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_668.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      generateOperation(this,unaff_EBP,sub_a_adr,sub_a_const,sub_a_atr0,&local_648,&local_658,
                        &local_668);
      if (local_668.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_668.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_749 = '\x02';
      std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
                ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)local_748,
                 (allocator<nigel::IM_Constant> *)&local_71c,&local_749);
      uVar7 = local_748._8_8_;
      local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_748._0_8_;
      local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
      local_748._0_8_ = (element_type *)0x0;
      local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_c_rel,&local_d8,&local_2a8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
      }
      local_749 = '\x02';
      std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
                ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)local_748,
                 (allocator<nigel::IM_Constant> *)&local_71c,&local_749);
      uVar7 = local_748._8_8_;
      local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_748._0_8_;
      local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
      local_748._0_8_ = (element_type *)0x0;
      local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_nz_rel,&local_e8,&local_2b8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
      break;
    case op_more_eql:
      local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_2d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,clr_c,&local_2c8,&local_2d8);
      local_678.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_678.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_708._M_pi;
      local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Stack_700._M_pi;
      if (_Stack_700._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_700._M_pi)->_M_use_count = (_Stack_700._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_700._M_pi)->_M_use_count = (_Stack_700._M_pi)->_M_use_count + 1;
        }
      }
      local_698.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_AstCondition).super_AstExpr.token.
           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_698.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_AstCondition).super_AstExpr.token.
           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_698.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_698.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_698.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_698.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_698.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      generateOperation(this,unaff_EBP,sub_a_adr,sub_a_const,sub_a_atr0,&local_678,&local_688,
                        &local_698);
      if (local_698.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_698.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_678.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_678.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_749 = '\x02';
      std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
                ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)local_748,
                 (allocator<nigel::IM_Constant> *)&local_71c,&local_749);
      uVar7 = local_748._8_8_;
      local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_748._0_8_;
      local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_;
      local_748._0_8_ = (element_type *)0x0;
      local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_2e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_c_rel,&local_f8,&local_2e8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
      break;
    default:
      goto switchD_0015a555_default;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
    }
switchD_0015a555_default:
    if (_Stack_700._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_700._M_pi);
    }
    _Var10._M_pi = a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var10 = a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    }
    break;
  case combinationCondition:
    AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)&a);
    iVar6 = IM_Condition::nextConditionPos;
    TVar3 = (a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->op;
    if (TVar3 == op_not) {
      local_6e8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->rVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_AstExpr;
      local_6e8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->rVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_6e8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_6e8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_6e8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_6e8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_6e8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                  *)(local_508 + 0x10),&varList->_M_t);
      parseCondition(this,&local_6e8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                      *)(local_508 + 0x10));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                   *)(local_508 + 0x10));
      if (local_6e8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_6e8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_748[0] = 2;
      std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
                ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)&conditionPos,
                 (allocator<nigel::IM_Constant> *)&local_708,local_748);
      _Var10 = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
      local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_348.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_348.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_rel,&local_158,&local_348);
      if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
      }
    }
    else if (TVar3 == op_or_log) {
      IM_Condition::nextConditionPos = IM_Condition::nextConditionPos + 1;
      local_6c8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->lVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_AstExpr;
      local_6c8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->lVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_6c8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_6c8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_6c8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_6c8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_6c8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::_Rb_tree(&local_498,&varList->_M_t);
      parseCondition(this,&local_6c8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                      *)&local_498);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::~_Rb_tree(&local_498);
      if (local_6c8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_6c8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_748[0] = 2;
      std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
                ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)&conditionPos,
                 (allocator<nigel::IM_Constant> *)&local_708,local_748);
      _Var10 = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
      local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_318.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_318.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_rel,&local_128,&local_318);
      if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
      }
      if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_748[0] = 3;
      std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
                ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)&conditionPos,
                 (allocator<nigel::IM_Constant> *)&local_708,local_748);
      _Var10 = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
      local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_328.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_328.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_rel,&local_138,&local_328);
      if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
      }
      if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_708._M_pi._0_4_ = iVar6;
      local_71c = CONCAT31(local_71c._1_3_,1);
      std::__shared_ptr<nigel::IM_Condition,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Condition>,unsigned_int&,bool&>
                ((__shared_ptr<nigel::IM_Condition,(__gnu_cxx::_Lock_policy)2> *)&conditionPos,
                 (allocator<nigel::IM_Condition> *)local_748,(uint *)&local_708,(bool *)&local_71c);
      _Var10 = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
      local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_338.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_338.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_abs,&local_148,&local_338);
      if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
      }
      if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_6d8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->rVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_AstExpr;
      local_6d8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->rVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_6d8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_6d8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_6d8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_6d8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_6d8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::_Rb_tree(&local_4c8,&varList->_M_t);
      parseCondition(this,&local_6d8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                      *)&local_4c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::~_Rb_tree(&local_4c8);
      if (local_6d8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_6d8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count = 1;
      (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = 1;
      (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00184648;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[1]._M_use_count = 0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[1]._M_weak_count = 0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[2]._M_use_count = 0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[2]._M_weak_count = 0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[4]._vptr__Sp_counted_base =
           (_func_int **)
           (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 5);
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[4]._M_use_count = 0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[4]._M_weak_count = 0;
      *(undefined1 *)
       &conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[5]._vptr__Sp_counted_base = 0;
      *(undefined4 *)
       &conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._vptr__Sp_counted_base = 4;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[3]._M_use_count = iVar6;
      std::__cxx11::
      list<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
      ::push_back(&this->base->imCommands,&conditionPos);
    }
    else {
      _Var10 = a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
      if (TVar3 != op_and_log) break;
      IM_Condition::nextConditionPos = IM_Condition::nextConditionPos + 1;
      local_6a8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->lVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_AstExpr;
      local_6a8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->lVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_6a8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_6a8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_6a8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_6a8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_6a8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::_Rb_tree(&local_438,&varList->_M_t);
      parseCondition(this,&local_6a8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                      *)&local_438);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::~_Rb_tree(&local_438);
      if (local_6a8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_6a8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_748[0] = 3;
      std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Constant>,unsigned_char&>
                ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)&conditionPos,
                 (allocator<nigel::IM_Constant> *)&local_708,local_748);
      _Var10 = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
      local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_2f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_rel,&local_108,&local_2f8);
      if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
      }
      if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_708._M_pi._0_4_ = iVar6;
      local_71c = local_71c & 0xffffff00;
      std::__shared_ptr<nigel::IM_Condition,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_Condition>,unsigned_int&,bool&>
                ((__shared_ptr<nigel::IM_Condition,(__gnu_cxx::_Lock_policy)2> *)&conditionPos,
                 (allocator<nigel::IM_Condition> *)local_748,(uint *)&local_708,(bool *)&local_71c);
      _Var10 = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
      local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_308.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_308.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,jmp_abs,&local_118,&local_308);
      if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
      }
      if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_6b8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->rVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_AstExpr;
      local_6b8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->rVal).super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_6b8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_6b8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_6b8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_6b8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_6b8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::_Rb_tree(&local_468,&varList->_M_t);
      parseCondition(this,&local_6b8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                      *)&local_468);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::~_Rb_tree(&local_468);
      if (local_6b8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_6b8.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count = 1;
      (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = 1;
      (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00184648;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[1]._M_use_count = 0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[1]._M_weak_count = 0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[2]._M_use_count = 0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[2]._M_weak_count = 0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[4]._vptr__Sp_counted_base =
           (_func_int **)
           (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 5);
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[4]._M_use_count = 0;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[4]._M_weak_count = 0;
      *(undefined1 *)
       &conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[5]._vptr__Sp_counted_base = 0;
      *(undefined4 *)
       &conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._vptr__Sp_counted_base = 4;
      conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[3]._M_use_count = iVar6;
      std::__cxx11::
      list<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
      ::push_back(&this->base->imCommands,&conditionPos);
    }
    _Var10._M_pi = a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var10 = a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    }
  }
  if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0015b870:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
  }
  return;
}

Assistant:

void IMC_Generator::parseCondition( std::shared_ptr<AstExpr> ast, std::map<String, std::shared_ptr<IM_Variable>> varList )
	{
		if( ast->type == AstExpr::Type::booleanParenthesis )
		{//Parenthesis block
			parseCondition( ast->as<AstBooleanParenthesis>()->content, varList );
		}
		else if( ast->type == AstExpr::Type::keywordCondition )
		{//Keyword (true/false)
			if( !ast->as<AstKeywordCondition>()->val )
			{//Is false
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 2 ) );
			}
		}
		else if( ast->type == AstExpr::Type::arithmenticCondition )
		{//Arithmetic expression will be converted into boolean expression (0=false)
			auto ret = ast->as<AstArithmeticCondition>()->ret;
			OperationType ot;//Operator type combination
			std::shared_ptr<IM_Operator> op;

			//Memorize val
			if( ret->type == AstExpr::Type::variable )
			{
				ot = OT::v;
				op = varList[ret->as<AstVariable>()->name];
			}
			else if( ret->type == AstExpr::Type::literal )
			{
				ot = OT::c;
				op = IM_Constant::fromAstLiteral( ret->as<AstLiteral>() );
			}
			else if( ret->type == AstExpr::Type::term ||
					 ret->type == AstExpr::Type::unary ||
					 ret->type == AstExpr::Type::parenthesis ||
					 ret->type == AstExpr::Type::functionCall ||
					 ret->type == AstExpr::Type::refer ||
					 ret->type == AstExpr::Type::derefer )
			{
				ot = OT::t;
				parseAst( ret, varList );
			}

			generateMoveA( ot, op );
			addCmd( HexOp::jmp_z_rel, IM_Constant::fromConstant( 2 ) );
		}
		else if( ast->type == AstExpr::Type::comparisonCondition )
		{//Comparison of two returnables
			auto a = ast->as<AstComparisonCondition>();
			OC comb;//Operator type combination
			std::shared_ptr<IM_Operator> lOp;
			std::shared_ptr<IM_Operator> rOp;

			//Memorize rVal
			if( a->rVal->type == AstExpr::Type::variable ) rOp = varList[a->rVal->as<AstVariable>()->name];
			else if( a->rVal->type == AstExpr::Type::literal ) rOp = IM_Constant::fromAstLiteral( a->rVal->as<AstLiteral>() );
			else if( a->rVal->type == AstExpr::Type::term ||
					 a->rVal->type == AstExpr::Type::unary ||
					 a->rVal->type == AstExpr::Type::parenthesis ||
					 a->rVal->type == AstExpr::Type::functionCall ||
					 a->rVal->type == AstExpr::Type::refer ||
					 a->rVal->type == AstExpr::Type::derefer )
			{
				parseAst( a->rVal, varList );
				if( a->lVal->type == AstExpr::Type::term ||
					a->lVal->type == AstExpr::Type::unary ||
					a->lVal->type == AstExpr::Type::parenthesis ||
					a->lVal->type == AstExpr::Type::functionCall ||
					a->lVal->type == AstExpr::Type::refer ||
					a->lVal->type == AstExpr::Type::derefer )//push to stack if OC::tt
					addCmd( HexOp::push_adr, IM_SFR::getSFR( IM_SFR::SFR::A ) );
				else addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			//Check lValue and combination
			if( a->lVal->type == AstExpr::Type::variable )
			{//lValue is a variable
				lOp = varList[a->lVal->as<AstVariable>()->name];
				if( a->rVal->type == AstExpr::Type::variable ) comb = OC::vv;
				else if( a->rVal->type == AstExpr::Type::literal ) comb = OC::vc;
				else if( a->rVal->type == AstExpr::Type::term ||
						 a->rVal->type == AstExpr::Type::unary ||
						 a->rVal->type == AstExpr::Type::parenthesis ||
						 a->rVal->type == AstExpr::Type::functionCall ||
						 a->rVal->type == AstExpr::Type::refer ||
						 a->rVal->type == AstExpr::Type::derefer ) comb = OC::vt;
			}
			else if( a->lVal->type == AstExpr::Type::literal )
			{//lValue is a constant
				lOp = IM_Constant::fromAstLiteral( a->lVal->as<AstLiteral>() );
				if( a->rVal->type == AstExpr::Type::variable ) comb = OC::cv;
				else if( a->rVal->type == AstExpr::Type::literal ) comb = OC::cc;
				else if( a->rVal->type == AstExpr::Type::term ||
						 a->rVal->type == AstExpr::Type::unary ||
						 a->rVal->type == AstExpr::Type::parenthesis ||
						 a->rVal->type == AstExpr::Type::functionCall ||
						 a->rVal->type == AstExpr::Type::refer ||
						 a->rVal->type == AstExpr::Type::derefer ) comb = OC::ct;
			}
			else if( a->lVal->type == AstExpr::Type::term ||
					 a->lVal->type == AstExpr::Type::unary ||
					 a->lVal->type == AstExpr::Type::parenthesis ||
					 a->lVal->type == AstExpr::Type::functionCall ||
					 a->lVal->type == AstExpr::Type::refer ||
					 a->lVal->type == AstExpr::Type::derefer )
			{//lValue is a term
				parseAst( a->lVal, varList );
				if( a->rVal->type == AstExpr::Type::variable ) comb = OC::tv;
				else if( a->rVal->type == AstExpr::Type::literal ) comb = OC::tc;
				else if( a->rVal->type == AstExpr::Type::term ||
						 a->rVal->type == AstExpr::Type::unary ||
						 a->rVal->type == AstExpr::Type::parenthesis ||
						 a->rVal->type == AstExpr::Type::functionCall ||
						 a->rVal->type == AstExpr::Type::refer ||
						 a->rVal->type == AstExpr::Type::derefer )
				{//pop from stack to B
					comb = OC::tt;
					addCmd( HexOp::pop_adr, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				}
			}

			//Handle operation
			if( a->op == Token::Type::op_eql )
			{// ==
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_nz_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_not_eql )
			{// !=
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_z_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_less )
			{// <
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_nc_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_more )
			{// >
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_c_rel, IM_Constant::fromConstant( 4 ) );
				addCmd( HexOp::jmp_z_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_less_eql )
			{// <=
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_c_rel, IM_Constant::fromConstant( 2 ) );//Is true -> ignore next
				addCmd( HexOp::jmp_nz_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_more_eql )
			{// >=
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_c_rel, IM_Constant::fromConstant( 2 ) );
			}

		}
		else if( ast->type == AstExpr::Type::combinationCondition )
		{//Combination of two conditionals
			auto a = ast->as<AstComparisonCondition>();

			if( a->op == Token::Type::op_and_log )
			{// &&
				u32 id = IM_Condition::getNextConditionPos();

				parseCondition( a->lVal, varList );
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 3 ) );//true
				addCmd( HexOp::jmp_abs, IM_Condition::getNew( id, false ) );//false
				parseCondition( a->rVal, varList );

				auto conditionPos = std::make_shared<IM_Command>();
				conditionPos->type = IM_Command::Type::conditionEnd;
				conditionPos->id = id;
				base->imCommands.push_back( conditionPos );
			}
			else if( a->op == Token::Type::op_or_log )
			{// ||
				u32 id = IM_Condition::getNextConditionPos();

				parseCondition( a->lVal, varList );
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 2 ) );//true. Has to be a rel jmp because next command (2byte) will be false-jmp-destination.
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 3 ) );
				addCmd( HexOp::jmp_abs, IM_Condition::getNew( id, true ) );//true
				parseCondition( a->rVal, varList );

				auto conditionPos = std::make_shared<IM_Command>();
				conditionPos->type = IM_Command::Type::conditionEnd;
				conditionPos->id = id;
				base->imCommands.push_back( conditionPos );
			}
			else if( a->op == Token::Type::op_not )
			{// !
				parseCondition( a->rVal, varList );
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 2 ) );
			}
		}
		else
		{//Unknown condition ast
			generateNotification( NT::err_expectConditionInParanthesis, ast->token );
		}
	}